

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,ConstSchema constant)

{
  PointerReader reader;
  void *pvVar1;
  byte bVar2;
  ElementSize expectedElementSize;
  Which WVar3;
  undefined2 uVar4;
  ListSchema LVar5;
  Fault f;
  Reader value;
  Type type;
  Reader local_130;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  SegmentReader *in_stack_ffffffffffffff18;
  anon_union_8_2_eba6ea51_for_Type_5 local_e0;
  void *local_d8;
  SegmentReader *local_d0;
  uint local_c8;
  StructPointerCount local_c4;
  StructDataBitCount local_c0;
  StructDataBitCount local_b4;
  Type local_b0;
  anon_union_8_2_eba6ea51_for_Type_5 local_a0;
  undefined1 local_98 [24];
  StructDataBitCount SStack_80;
  undefined4 uStack_7c;
  byte *local_78;
  Schema local_58;
  PointerReader local_50;
  
  this->type = VOID;
  local_58 = constant.super_Schema.raw;
  local_b0 = ConstSchema::getType((ConstSchema *)&local_58);
  Schema::getProto(&local_130,&local_58);
  if (local_130._reader.pointerCount < 5) {
    SStack_80 = 0x7fffffff;
    local_98._8_8_ = (RawBrandedSchema *)0x0;
    local_98._16_8_ = (SegmentReader *)0x0;
    local_98._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_98._0_8_ = CONCAT44(local_130._reader.segment._4_4_,(Type)local_130._reader.segment);
    local_98._16_8_ = (long)local_130._reader.pointers + 0x20;
    local_98._8_8_ = local_130._reader.capTable;
    SStack_80 = local_130._reader.nestingLimit;
  }
  _::PointerReader::getStruct
            ((StructReader *)&stack0xffffffffffffff18,(PointerReader *)local_98,(word *)0x0);
  WVar3 = LIST;
  if (local_b0.listDepth == '\0') {
    WVar3 = local_b0.baseType;
  }
  switch(WVar3) {
  case VOID:
    local_130._reader.segment._0_4_ = VOID;
    operator=(this,(Reader *)&local_130);
    break;
  case BOOL:
    if (local_c8 < 0x11) {
      bVar2 = 0;
    }
    else {
      bVar2 = *(byte *)((long)local_d8 + 2) & 1;
    }
    local_130._reader.segment._0_4_ = BOOL;
    local_130._reader.capTable._0_1_ = bVar2;
    operator=(this,(Reader *)&local_130);
    break;
  case INT8:
    if (local_c8 < 0x18) {
      local_130._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_130._reader.capTable = (CapTableReader *)(long)*(char *)((long)local_d8 + 2);
    }
    local_130._reader.segment._0_4_ = INT;
    operator=(this,(Reader *)&local_130);
    break;
  case INT16:
    if (local_c8 < 0x20) {
      local_130._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_130._reader.capTable = (CapTableReader *)(long)*(short *)((long)local_d8 + 2);
    }
    local_130._reader.segment._0_4_ = INT;
    operator=(this,(Reader *)&local_130);
    break;
  case INT32:
    if (local_c8 < 0x40) {
      local_130._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_130._reader.capTable = (CapTableReader *)(long)*(int *)((long)local_d8 + 4);
    }
    local_130._reader.segment._0_4_ = INT;
    operator=(this,(Reader *)&local_130);
    break;
  case INT64:
    if (local_c8 < 0x80) {
      local_130._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_130._reader.capTable = *(CapTableReader **)((long)local_d8 + 8);
    }
    local_130._reader.segment._0_4_ = INT;
    operator=(this,(Reader *)&local_130);
    break;
  case UINT8:
    if (local_c8 < 0x18) {
      local_130._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_130._reader.capTable = (CapTableReader *)(ulong)*(byte *)((long)local_d8 + 2);
    }
    local_130._reader.segment._0_4_ = UINT;
    operator=(this,(Reader *)&local_130);
    break;
  case UINT16:
    if (local_c8 < 0x20) {
      local_130._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_130._reader.capTable = (CapTableReader *)(ulong)*(ushort *)((long)local_d8 + 2);
    }
    local_130._reader.segment._0_4_ = UINT;
    operator=(this,(Reader *)&local_130);
    break;
  case UINT32:
    if (local_c8 < 0x40) {
      local_130._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_130._reader.capTable = (CapTableReader *)(ulong)*(uint *)((long)local_d8 + 4);
    }
    local_130._reader.segment._0_4_ = UINT;
    operator=(this,(Reader *)&local_130);
    break;
  case UINT64:
    if (local_c8 < 0x80) {
      local_130._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_130._reader.capTable = *(CapTableReader **)((long)local_d8 + 8);
    }
    local_130._reader.segment._0_4_ = UINT;
    operator=(this,(Reader *)&local_130);
    break;
  case FLOAT32:
    local_130._reader.capTable = (CapTableReader *)0x0;
    if (0x3f < local_c8) {
      local_130._reader.capTable = (CapTableReader *)(double)*(float *)((long)local_d8 + 4);
    }
    local_130._reader.segment._0_4_ = FLOAT;
    operator=(this,(Reader *)&local_130);
    break;
  case FLOAT64:
    local_130._reader.capTable._0_4_ = 0;
    local_130._reader.capTable._4_4_ = 0;
    if (0x7f < local_c8) {
      local_130._reader.capTable._0_4_ = (undefined4)*(undefined8 *)((long)local_d8 + 8);
      local_130._reader.capTable._4_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)local_d8 + 8) >> 0x20);
    }
    local_130._reader.segment._0_4_ = FLOAT;
    operator=(this,(Reader *)&local_130);
    break;
  case TEXT:
    if (local_c4 == 0) {
      local_c0 = 0x7fffffff;
      local_e0.schema = (RawBrandedSchema *)0x0;
      local_d0 = (SegmentReader *)0x0;
      in_stack_ffffffffffffff18 = (SegmentReader *)0x0;
    }
    local_98._0_8_ = in_stack_ffffffffffffff18;
    local_98._8_8_ = local_e0;
    local_98._16_8_ = local_d0;
    SStack_80 = local_c0;
    local_130._reader._8_16_ =
         _::PointerReader::getBlob<capnp::Text>((PointerReader *)local_98,(void *)0x0,0);
    local_130._reader.segment._0_4_ = TEXT;
    operator=(this,(Reader *)&local_130);
    break;
  case DATA:
    if (local_c4 == 0) {
      local_c0 = 0x7fffffff;
      local_e0.schema = (RawBrandedSchema *)0x0;
      local_d0 = (SegmentReader *)0x0;
      in_stack_ffffffffffffff18 = (SegmentReader *)0x0;
    }
    local_98._0_8_ = in_stack_ffffffffffffff18;
    local_98._8_8_ = local_e0;
    local_98._16_8_ = local_d0;
    SStack_80 = local_c0;
    local_130._reader._8_16_ =
         _::PointerReader::getBlob<capnp::Data>((PointerReader *)local_98,(void *)0x0,0);
    local_130._reader.segment._0_4_ = DATA;
    operator=(this,(Reader *)&local_130);
    break;
  case LIST:
    if (local_c4 == 0) {
      local_b4 = 0x7fffffff;
      local_e0.schema = (RawBrandedSchema *)0x0;
      local_d0 = (SegmentReader *)0x0;
      in_stack_ffffffffffffff18 = (SegmentReader *)0x0;
    }
    else {
      local_b4 = local_c0;
    }
    LVar5 = Type::asList(&local_b0);
    local_a0 = LVar5.elementType.field_4;
    local_50.nestingLimit = local_b4;
    WVar3 = LIST;
    if (((undefined1  [16])LVar5.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
    {
      WVar3 = LVar5.elementType.baseType;
    }
    local_50.segment = in_stack_ffffffffffffff18;
    local_50.capTable = (CapTableReader *)local_e0;
    local_50.pointer = (WirePointer *)local_d0;
    expectedElementSize = anon_unknown_71::elementSizeFor(WVar3);
    _::PointerReader::getList
              ((ListReader *)(local_98 + 0x10),&local_50,expectedElementSize,(word *)0x0);
    local_98._8_8_ = local_a0;
    local_130._reader.segment._0_4_ = LIST;
    local_130._reader._32_8_ = CONCAT44(uStack_7c,SStack_80);
    local_130._reader.pointers = (WirePointer *)local_98._16_8_;
    local_130._reader._40_8_ = local_78;
    local_130._reader.data = local_a0.schema;
    local_130._reader.capTable = (CapTableReader *)LVar5.elementType._0_8_;
    local_98._0_8_ = LVar5.elementType._0_8_;
    operator=(this,(Reader *)&local_130);
    break;
  case ENUM:
    local_130._reader.capTable = (CapTableReader *)Type::asEnum(&local_b0);
    if (local_c8 < 0x20) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined2 *)((long)local_d8 + 2);
    }
    local_130._reader.segment._0_4_ = ENUM;
    local_130._reader.data._0_2_ = uVar4;
    operator=(this,(Reader *)&local_130);
    break;
  case STRUCT:
    local_98._0_8_ = in_stack_ffffffffffffff18;
    if (local_c4 == 0) {
      local_c0 = 0x7fffffff;
      local_e0.schema = (RawBrandedSchema *)0x0;
      local_d0 = (SegmentReader *)0x0;
      local_98._0_8_ = (SegmentReader *)0x0;
    }
    local_98._8_8_ = local_e0;
    local_98._16_8_ = local_d0;
    SStack_80 = local_c0;
    Type::asStruct(&local_b0);
    reader.capTable = (CapTableReader *)in_stack_ffffffffffffff08;
    reader.segment = (SegmentReader *)in_stack_ffffffffffffff00;
    reader.pointer = (WirePointer *)in_stack_ffffffffffffff10;
    reader._24_8_ = in_stack_ffffffffffffff18;
    _::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
              (reader,(StructSchema)local_98._8_8_);
    local_130._reader.segment._0_4_ = STRUCT;
    operator=(this,(Reader *)&local_130);
    break;
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              ((Fault *)&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x5ba,FAILED,(char *)0x0,"\"Constants can\'t have interface type.\"",
               (char (*) [37])"Constants can\'t have interface type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  case ANY_POINTER:
    if (local_c4 == 0) {
      local_c0 = 0x7fffffff;
      local_e0.schema = (RawBrandedSchema *)0x0;
      local_d0 = (SegmentReader *)0x0;
      in_stack_ffffffffffffff18 = (SegmentReader *)0x0;
    }
    local_130._reader.segment._0_4_ = ANY_POINTER;
    local_130._reader.data = local_e0.schema;
    local_130._reader.capTable = (CapTableReader *)in_stack_ffffffffffffff18;
    local_130._reader.dataSize = local_c0;
    local_130._reader.pointers = (WirePointer *)local_d0;
    operator=(this,(Reader *)&local_130);
    break;
  default:
    goto switchD_001a9c68_default;
  }
  if (((Type)local_130._reader.segment == CAPABILITY) &&
     (pvVar1 = local_130._reader.data, (ClientHook *)local_130._reader.data != (ClientHook *)0x0)) {
    local_130._reader.data = (void *)0x0;
    (*(code *)((Arena *)(local_130._reader.capTable)->_vptr_CapTableReader)->_vptr_Arena)
              (local_130._reader.capTable,
               (_func_int *)((long)(*(Arena **)pvVar1)[-2]._vptr_Arena + (long)(Arena **)pvVar1));
  }
switchD_001a9c68_default:
  return;
}

Assistant:

DynamicValue::Reader::Reader(ConstSchema constant): type(VOID) {
  auto type = constant.getType();
  auto value = constant.getProto().getConst().getValue();
  switch (type.which()) {
    case schema::Type::VOID: *this = capnp::VOID; break;
    case schema::Type::BOOL: *this = value.getBool(); break;
    case schema::Type::INT8: *this = value.getInt8(); break;
    case schema::Type::INT16: *this = value.getInt16(); break;
    case schema::Type::INT32: *this = value.getInt32(); break;
    case schema::Type::INT64: *this = value.getInt64(); break;
    case schema::Type::UINT8: *this = value.getUint8(); break;
    case schema::Type::UINT16: *this = value.getUint16(); break;
    case schema::Type::UINT32: *this = value.getUint32(); break;
    case schema::Type::UINT64: *this = value.getUint64(); break;
    case schema::Type::FLOAT32: *this = value.getFloat32(); break;
    case schema::Type::FLOAT64: *this = value.getFloat64(); break;
    case schema::Type::TEXT: *this = value.getText(); break;
    case schema::Type::DATA: *this = value.getData(); break;

    case schema::Type::ENUM:
      *this = DynamicEnum(type.asEnum(), value.getEnum());
      break;

    case schema::Type::STRUCT:
      *this = value.getStruct().getAs<DynamicStruct>(type.asStruct());
      break;

    case schema::Type::LIST:
      *this = value.getList().getAs<DynamicList>(type.asList());
      break;

    case schema::Type::ANY_POINTER:
      *this = value.getAnyPointer();
      break;

    case schema::Type::INTERFACE:
      KJ_FAIL_ASSERT("Constants can't have interface type.");
  }
}